

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interactive.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  char *pcVar4;
  string local_c0 [55];
  byte local_89;
  string local_88 [7];
  bool quit;
  string input;
  undefined1 local_68 [8];
  Pyraminx myPyraminx;
  
  myPyraminx.green_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._4_4_
       = 0;
  Pyraminx::Pyraminx((Pyraminx *)local_68);
  std::__cxx11::string::string(local_88);
  local_89 = 0;
  printf(
        "Enter a command of the form AX[`] where L is the letter corresponding with a \ncorner of the Pyraminx (U, L, R, B),  X is a integer from 0-3 specifying the \nlayer of the row relative to the tip (layer 0) at the corner given, and the \noptional ` mark indicates whether the layer should be turned counterclockwise.\nThe default rotation is clockwise. The corner characters are case insensitive.\nThere should be no spaces in your command.\nEnter \'s\' to scramble, \'q\' to quit.\n"
        );
  Pyraminx::print((Pyraminx *)local_68);
  while (((local_89 ^ 0xff) & 1) != 0) {
    printf("Enter command: ");
    std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)&std::cin,local_88);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_88);
      if ((*pcVar4 == 'q') ||
         (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_88), *pcVar4 == 'Q')) {
        local_89 = 1;
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_88);
        if ((*pcVar4 == 's') ||
           (pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)local_88), *pcVar4 == 'S')) {
          Pyraminx::scramble((Pyraminx *)local_68,0x14);
        }
        else {
          std::__cxx11::string::string(local_c0,local_88);
          input_to_turn((Pyraminx *)local_68,(string *)local_c0);
          std::__cxx11::string::~string(local_c0);
        }
        printf("\n");
        Pyraminx::print((Pyraminx *)local_68);
        uVar2 = Pyraminx::get_heuristic((Pyraminx *)local_68);
        printf("H: %i\n",(ulong)uVar2);
        bVar1 = Pyraminx::is_solved((Pyraminx *)local_68);
        if (bVar1) {
          printf("Solved!\n");
        }
      }
    }
  }
  std::__cxx11::string::~string(local_88);
  Pyraminx::~Pyraminx((Pyraminx *)local_68);
  return myPyraminx.green_face.super___shared_ptr<Face,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi._4_4_;
}

Assistant:

int main(){
    Pyraminx myPyraminx;
    std::string input;
    bool quit = false;
    printf("Enter a command of the form AX[`] where L is the letter corresponding with a \n"
           "corner of the Pyraminx (U, L, R, B),  X is a integer from 0-3 specifying the \n"
           "layer of the row relative to the tip (layer 0) at the corner given, and the \n"
           "optional ` mark indicates whether the layer should be turned counterclockwise.\n"
           "The default rotation is clockwise. The corner characters are case insensitive.\n"
           "There should be no spaces in your command.\n"
           "Enter 's' to scramble, 'q' to quit.\n");
    myPyraminx.print();
    while(!quit){
        printf("Enter command: ");
        std::getline (std::cin, input);
        if(!input.empty()){
            if(input[0] == 'q' || input[0] == 'Q'){
                quit = true;
                continue;
            }
            else if(input[0] == 's' || input[0] == 'S'){
                myPyraminx.scramble(20);
            }
            else{
                input_to_turn(myPyraminx, input);
            }
            printf("\n");
            myPyraminx.print();
            printf("H: %i\n", myPyraminx.get_heuristic());
            if(myPyraminx.is_solved()){
                printf("Solved!\n");
            }
        } //if not empty
    }// while
}